

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O2

SpatialBinSplit<16UL> * __thiscall
embree::avx::SpatialBinInfo<16UL,_embree::PrimRef>::best
          (SpatialBinSplit<16UL> *__return_storage_ptr__,SpatialBinInfo<16UL,_embree::PrimRef> *this
          ,SpatialBinMapping<16UL> *mapping,size_t blocks_shift)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vfloat4 rAreas [16];
  vuint4 rCounts [16];
  undefined8 uStack_908;
  float afStack_900 [62];
  undefined1 auStack_808 [16];
  float afStack_7f8 [64];
  undefined1 auStack_6f8 [1136];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [2] [16];
  float afStack_1f8 [126];
  
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  auVar21._8_4_ = 0xff800000;
  auVar21._0_8_ = 0xff800000ff800000;
  auVar21._12_4_ = 0xff800000;
  auVar23._8_4_ = 0x7f800000;
  auVar23._0_8_ = 0x7f8000007f800000;
  auVar23._12_4_ = 0x7f800000;
  lVar17 = 0x7f0;
  auVar4 = auVar23;
  auVar29 = auVar21;
  auVar24 = auVar23;
  auVar3 = auVar21;
  for (lVar15 = 0x5f0; lVar15 != 0x50; lVar15 = lVar15 + -0x60) {
    auVar25 = vpaddd_avx(auVar20._0_16_,
                         *(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar17));
    auVar20 = ZEXT1664(auVar25);
    *(undefined1 (*) [16])(auStack_808 + lVar17) = auVar25;
    auVar24 = vminps_avx(auVar24,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar15));
    auVar3 = vmaxps_avx(auVar3,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar15));
    auVar22 = vsubps_avx(auVar3,auVar24);
    auVar4 = vminps_avx(auVar4,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar15));
    auVar29 = vmaxps_avx(auVar29,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar15));
    auVar27 = vsubps_avx(auVar29,auVar4);
    auVar25 = vinsertps_avx(auVar27,auVar22,0x4c);
    auVar28 = vshufpd_avx(auVar22,auVar22,1);
    auVar28 = vinsertps_avx(auVar28,auVar27,0x9c);
    auVar22 = vunpcklps_avx(auVar22,auVar27);
    auVar27._0_4_ = auVar25._0_4_ * auVar28._0_4_ + (auVar25._0_4_ + auVar28._0_4_) * auVar22._0_4_;
    auVar27._4_4_ = auVar25._4_4_ * auVar28._4_4_ + (auVar25._4_4_ + auVar28._4_4_) * auVar22._4_4_;
    auVar27._8_4_ = auVar25._8_4_ * auVar28._8_4_ + (auVar25._8_4_ + auVar28._8_4_) * auVar22._8_4_;
    auVar27._12_4_ =
         auVar25._12_4_ * auVar28._12_4_ + (auVar25._12_4_ + auVar28._12_4_) * auVar22._12_4_;
    uVar2 = vmovlps_avx(auVar27);
    *(undefined8 *)((long)&uStack_908 + lVar17) = uVar2;
    auVar23 = vminps_avx(auVar23,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar15));
    auVar21 = vmaxps_avx(auVar21,*(undefined1 (*) [16])
                                  ((long)&this->bounds[0][0].lower.field_0 + lVar15));
    auVar22 = vsubps_avx(auVar21,auVar23);
    auVar25 = vmovshdup_avx(auVar22);
    auVar28 = vshufpd_avx(auVar22,auVar22,1);
    *(float *)((long)afStack_900 + lVar17) =
         auVar25._0_4_ * auVar28._0_4_ + (auVar25._0_4_ + auVar28._0_4_) * auVar22._0_4_;
    *(undefined4 *)((long)afStack_900 + lVar17 + 4) = 0;
    lVar17 = lVar17 + -0x10;
  }
  iVar14 = -1;
  auVar4 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)blocks_shift & 0x1f))),0);
  auVar24 = ZEXT816(0) << 0x40;
  auVar29._8_4_ = 0xff800000;
  auVar29._0_8_ = 0xff800000ff800000;
  auVar29._12_4_ = 0xff800000;
  auVar25._8_8_ = 0x100000001;
  auVar25._0_8_ = 0x100000001;
  local_218[0]._8_4_ = 0x7f800000;
  local_218[0]._0_8_ = 0x7f8000007f800000;
  local_218[0]._12_4_ = 0x7f800000;
  local_248 = ZEXT816(0) << 0x40;
  lVar17 = 0x600;
  local_238 = ZEXT816(0) << 0x40;
  local_228 = ZEXT816(0) << 0x40;
  auVar21 = local_218[0];
  auVar3 = auVar29;
  local_288 = local_218[0];
  local_278 = local_218[0];
  local_268 = auVar29;
  for (lVar15 = 0x50; lVar15 != 0x5f0; lVar15 = lVar15 + 0x60) {
    auVar24 = vpaddd_avx(auVar24,*(undefined1 (*) [16])
                                  ((long)&this->bounds[0][0].lower.field_0 + lVar17));
    auVar21 = vminps_avx(auVar21,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar15));
    auVar3 = vmaxps_avx(auVar3,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar15));
    auVar22 = vsubps_avx(auVar3,auVar21);
    local_288 = vminps_avx(local_288,
                           *(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar15));
    auVar29 = vmaxps_avx(auVar29,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar15));
    local_278 = vminps_avx(local_278,
                           *(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar15));
    auVar5 = vsubps_avx(auVar29,local_288);
    local_268 = vmaxps_avx(local_268,
                           *(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar15))
    ;
    auVar6 = vsubps_avx(local_268,local_278);
    auVar23 = vshufps_avx(auVar22,auVar6,0x65);
    auVar23 = vblendps_avx(auVar23,auVar5,2);
    auVar28 = vshufps_avx(auVar22,auVar6,0x96);
    auVar27 = vinsertps_avx(auVar28,auVar5,0x90);
    auVar28 = vshufps_avx(auVar22,auVar6,0);
    auVar5 = vinsertps_avx(auVar28,auVar5,0x10);
    auVar28 = vpaddd_avx(auVar4,auVar24);
    auVar22 = vpsrld_avx(auVar28,ZEXT416((uint)blocks_shift));
    auVar28 = vpaddd_avx(auVar4,*(undefined1 (*) [16])(auStack_6f8 + lVar17));
    auVar19 = vpsrld_avx(auVar28,ZEXT416((uint)blocks_shift));
    auVar28 = vpsrad_avx(auVar22,0x1f);
    auVar30._8_8_ = 0x4f0000004f000000;
    auVar30._0_8_ = 0x4f0000004f000000;
    auVar6 = vpand_avx(auVar28,auVar30);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar28 = vpand_avx(auVar22,auVar26);
    auVar28 = vcvtdq2ps_avx(auVar28);
    auVar22 = vpsrad_avx(auVar19,0x1f);
    auVar30 = vpand_avx(auVar30,auVar22);
    auVar22 = vpand_avx(auVar19,auVar26);
    auVar22 = vcvtdq2ps_avx(auVar22);
    auVar19._0_4_ =
         ((auVar23._0_4_ + auVar27._0_4_) * auVar5._0_4_ + auVar23._0_4_ * auVar27._0_4_) *
         (auVar6._0_4_ + auVar28._0_4_) +
         (auVar22._0_4_ + auVar30._0_4_) * *(float *)((long)afStack_7f8 + lVar17);
    auVar19._4_4_ =
         ((auVar23._4_4_ + auVar27._4_4_) * auVar5._4_4_ + auVar23._4_4_ * auVar27._4_4_) *
         (auVar6._4_4_ + auVar28._4_4_) +
         (auVar22._4_4_ + auVar30._4_4_) * *(float *)((long)afStack_7f8 + lVar17 + 4);
    auVar19._8_4_ =
         ((auVar23._8_4_ + auVar27._8_4_) * auVar5._8_4_ + auVar23._8_4_ * auVar27._8_4_) *
         (auVar6._8_4_ + auVar28._8_4_) +
         (auVar22._8_4_ + auVar30._8_4_) * *(float *)((long)afStack_7f8 + lVar17 + 8);
    auVar19._12_4_ =
         ((auVar23._12_4_ + auVar27._12_4_) * auVar5._12_4_ + auVar23._12_4_ * auVar27._12_4_) *
         (auVar6._12_4_ + auVar28._12_4_) +
         (auVar22._12_4_ + auVar30._12_4_) * *(float *)((long)afStack_7f8 + lVar17 + 0xc);
    auVar23 = vcmpps_avx(auVar19,local_218[0],1);
    local_248 = vblendvps_avx(local_248,*(undefined1 (*) [16])(auStack_6f8 + lVar17),auVar23);
    local_228 = vblendvps_avx(local_228,auVar25,auVar23);
    local_238 = vblendvps_avx(local_238,auVar24,auVar23);
    local_218[0] = vminps_avx(auVar19,local_218[0]);
    auVar25 = vpsubd_avx(auVar25,_DAT_01f46b70);
    lVar17 = lVar17 + 0x10;
  }
  iVar13 = 0;
  fVar18 = INFINITY;
  iVar12 = 0;
  iVar16 = 0;
  for (lVar15 = -3; lVar15 != 0; lVar15 = lVar15 + 1) {
    fVar1 = *(float *)((long)&(mapping->scale).field_0 + lVar15 * 4 + 0xc);
    if ((((fVar1 != 0.0) || (NAN(fVar1))) && (afStack_1f8[lVar15 + -5] < fVar18)) &&
       (*(int *)(local_218[-1] + lVar15 * 4 + 0xc) != 0)) {
      iVar12 = *(int *)(local_228 + lVar15 * 4 + -4);
      iVar16 = *(int *)(local_238 + lVar15 * 4 + -4);
      iVar14 = (int)lVar15 + 3;
      iVar13 = *(int *)(local_218[-1] + lVar15 * 4 + 0xc);
      fVar18 = afStack_1f8[lVar15 + -5];
    }
  }
  if (iVar14 == -1) {
    iVar12 = -1;
    iVar13 = 0;
    fVar18 = INFINITY;
    iVar16 = iVar12;
  }
  uVar2 = *(undefined8 *)&(mapping->inv_scale).field_0;
  uVar7 = *(undefined8 *)((long)&(mapping->inv_scale).field_0 + 8);
  uVar8 = *(undefined8 *)&(mapping->ofs).field_0;
  uVar9 = *(undefined8 *)((long)&(mapping->ofs).field_0 + 8);
  uVar10 = *(undefined8 *)&(mapping->scale).field_0;
  uVar11 = *(undefined8 *)((long)&(mapping->scale).field_0 + 8);
  __return_storage_ptr__->sah = fVar18;
  __return_storage_ptr__->dim = iVar14;
  __return_storage_ptr__->pos = iVar13;
  __return_storage_ptr__->left = iVar12;
  __return_storage_ptr__->right = iVar16;
  __return_storage_ptr__->factor = 1.0;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar8;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar9;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = uVar10;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uVar11;
  *(undefined8 *)&(__return_storage_ptr__->mapping).inv_scale.field_0 = uVar2;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).inv_scale.field_0 + 8) = uVar7;
  return __return_storage_ptr__;
}

Assistant:

SpatialBinSplit<BINS> best(const SpatialBinMapping<BINS>& mapping, const size_t blocks_shift) const 
      {
        /* sweep from right to left and compute parallel prefix of merged bounds */
        vfloat4 rAreas[BINS];
        vuint4 rCounts[BINS];
        vuint4 count = 0; BBox3fa bx = empty; BBox3fa by = empty; BBox3fa bz = empty;
        for (size_t i=BINS-1; i>0; i--)
        {
          count += numEnd[i];
          rCounts[i] = count;
          bx.extend(bounds[i][0]); rAreas[i][0] = halfArea(bx);
          by.extend(bounds[i][1]); rAreas[i][1] = halfArea(by);
          bz.extend(bounds[i][2]); rAreas[i][2] = halfArea(bz);
          rAreas[i][3] = 0.0f;
        }
        
        /* sweep from left to right and compute SAH */
        vuint4 blocks_add = (1 << blocks_shift)-1;
        vuint4 ii = 1; vfloat4 vbestSAH = pos_inf; vuint4 vbestPos = 0; vuint4 vbestlCount = 0; vuint4 vbestrCount = 0;
        count = 0; bx = empty; by = empty; bz = empty;
        for (size_t i=1; i<BINS; i++, ii+=1)
        {
          count += numBegin[i-1];
          bx.extend(bounds[i-1][0]); float Ax = halfArea(bx);
          by.extend(bounds[i-1][1]); float Ay = halfArea(by);
          bz.extend(bounds[i-1][2]); float Az = halfArea(bz);
          const vfloat4 lArea = vfloat4(Ax,Ay,Az,Az);
          const vfloat4 rArea = rAreas[i];
          const vuint4 lCount = (count     +blocks_add) >> (unsigned int)(blocks_shift);
          const vuint4 rCount = (rCounts[i]+blocks_add) >> (unsigned int)(blocks_shift);
          const vfloat4 sah = madd(lArea,vfloat4(lCount),rArea*vfloat4(rCount));
          // const vfloat4 sah = madd(lArea,vfloat4(vint4(lCount)),rArea*vfloat4(vint4(rCount)));
          const vbool4 mask = sah < vbestSAH;
          vbestPos      = select(mask,ii ,vbestPos);
          vbestSAH      = select(mask,sah,vbestSAH);
          vbestlCount   = select(mask,count,vbestlCount);
          vbestrCount   = select(mask,rCounts[i],vbestrCount);
        }
        
        /* find best dimension */
        float bestSAH = inf;
        int   bestDim = -1;
        int   bestPos = 0;
        unsigned int   bestlCount = 0;
        unsigned int   bestrCount = 0;
        for (int dim=0; dim<3; dim++) 
        {
          /* ignore zero sized dimensions */
          if (unlikely(mapping.invalid(dim)))
            continue;
          
          /* test if this is a better dimension */
          if (vbestSAH[dim] < bestSAH && vbestPos[dim] != 0) {
            bestDim = dim;
            bestPos = vbestPos[dim];
            bestSAH = vbestSAH[dim];
            bestlCount = vbestlCount[dim];
            bestrCount = vbestrCount[dim];
          }
        }
        assert(bestSAH >= 0.0f);
        
        /* return invalid split if no split found */
        if (bestDim == -1) 
          return SpatialBinSplit<BINS>(inf,-1,0,mapping);
        
        /* return best found split */
        return SpatialBinSplit<BINS>(bestSAH,bestDim,bestPos,bestlCount,bestrCount,1.0f,mapping);
      }